

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O0

void outputDomains(DomainSet *dSet,string *fname,MatrixProperties *matProp,int start,float hier)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  reference pDVar4;
  ostream *poVar5;
  long in_RDX;
  _Ios_Openmode in_ESI;
  float in_XMM0_Da;
  Domain d;
  iterator __end1;
  iterator __begin1;
  DomainSet *__range1;
  int res;
  ofstream file;
  vector<Domain,_std::allocator<Domain>_> *in_stack_fffffffffffffce8;
  ostream *in_stack_fffffffffffffcf0;
  __normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_> local_240 [2];
  int local_230;
  string local_220 [512];
  float local_20;
  
  local_20 = in_XMM0_Da;
  std::ofstream::ofstream(local_220);
  std::ofstream::open(local_220,in_ESI);
  local_230 = *(int *)(in_RDX + 0x30);
  local_240[0]._M_current =
       (Domain *)std::vector<Domain,_std::allocator<Domain>_>::begin(in_stack_fffffffffffffce8);
  std::vector<Domain,_std::allocator<Domain>_>::end(in_stack_fffffffffffffce8);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_> *
                       )in_stack_fffffffffffffcf0,
                       (__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_> *
                       )in_stack_fffffffffffffce8);
    if (!bVar3) break;
    pDVar4 = __gnu_cxx::__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>::
             operator*(local_240);
    sVar1 = pDVar4->start;
    sVar2 = pDVar4->end;
    poVar5 = std::operator<<((ostream *)local_220,(string *)(in_RDX + 0x10));
    poVar5 = std::operator<<(poVar5,"\t");
    poVar5 = std::operator<<(poVar5,"Matryoshka1.0");
    poVar5 = std::operator<<(poVar5,"\t");
    poVar5 = std::operator<<(poVar5,"Domain");
    poVar5 = std::operator<<(poVar5,"\t");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar1 * (long)local_230);
    poVar5 = std::operator<<(poVar5,"\t");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar2 * (long)local_230);
    poVar5 = std::operator<<(poVar5,"\t");
    poVar5 = std::operator<<(poVar5,".");
    poVar5 = std::operator<<(poVar5,"\t");
    poVar5 = std::operator<<(poVar5,".");
    poVar5 = std::operator<<(poVar5,"\t");
    poVar5 = std::operator<<(poVar5,".");
    poVar5 = std::operator<<(poVar5,"\t");
    in_stack_fffffffffffffcf0 = std::operator<<(poVar5,"Level=");
    in_stack_fffffffffffffce8 =
         (vector<Domain,_std::allocator<Domain>_> *)
         std::ostream::operator<<(in_stack_fffffffffffffcf0,local_20);
    std::ostream::operator<<(in_stack_fffffffffffffce8,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>::
    operator++(local_240);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void outputDomains(DomainSet dSet, string fname, MatrixProperties matProp, int start, float hier) {
    ofstream file;
    file.open(fname, ios::app);
    int res = matProp.resolution;
    for (auto d : dSet) {
        //file << matProp.chrom << "\t" << (d.start+start)*res << "\t" << (d.end+start)*res << "\t" << hier << endl;
        //file << chromosome << tool << feature << start << end << score << strand << frame << hier << endl;
        file << matProp.chrom << "\t" << "Matryoshka1.0" << "\t" << "Domain" << "\t" << (d.start)*res << "\t" <<
            (d.end)*res << "\t" << "." << "\t" << "." << "\t" << "." << "\t" << "Level=" << hier << endl;
    }
    file.close();
}